

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::intEqualsAfterUintCast
               (deInt32 value,deUint32 casted,Precision precision)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  deUint32 reference;
  
  if (precision < PRECISION_LAST) {
    lVar1 = *(long *)(&DAT_01c57f70 + (ulong)precision * 8);
  }
  else {
    lVar1 = 0;
  }
  uVar3 = (uint)(-1L << ((byte)lVar1 & 0x3f));
  if (((casted ^ value) & ~uVar3) != 0) {
    return false;
  }
  uVar2 = lVar1 - 1;
  do {
    if (((~(uint)(-1L << ((char)uVar2 + 1U & 0x3f)) & value >> 0x1f ^ casted) & uVar3) == 0) {
      return true;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x20);
  return uVar2 < 0x20;
}

Assistant:

static int getPrecisionNumIntegerBits (glu::Precision precision)
{
	switch (precision)
	{
		case glu::PRECISION_HIGHP:		return 32;
		case glu::PRECISION_MEDIUMP:	return 16;
		case glu::PRECISION_LOWP:		return 9;
		default:
			DE_ASSERT(false);
			return 0;
	}
}